

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O1

listNode * __thiscall rlist::listLast(rlist *this)

{
  listNode *plVar1;
  listNode *plVar2;
  
  plVar1 = this->rl->head;
  if (plVar1 == (listNode *)0x0) {
    return (listNode *)0x0;
  }
  if (plVar1->next != (listNode *)0x0) {
    do {
      plVar2 = plVar1;
      plVar1 = plVar2->next;
    } while (plVar2->next != (listNode *)0x0);
    this->view = plVar2;
    return plVar2;
  }
  return plVar1;
}

Assistant:

listNode * rlist::listLast(){
    if(rl->head!=NULL){
        if(rl->head->next!=NULL){
            view=rl->head;
            while(view->next!=NULL){
                view=view->next;
            }
            return view;
        }else{
            return rl->head;
        }
    }
    return NULL;
}